

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O3

int32 __thiscall
rw::PluginList::setStreamRightsCallback(PluginList *this,uint32 id,RightsCallback cb)

{
  LLLink *pLVar1;
  
  pLVar1 = &(this->plugins).link;
  do {
    pLVar1 = ((LLLink *)&pLVar1->next)->next;
    if (pLVar1 == &(this->plugins).link) {
      return -1;
    }
  } while (*(uint32 *)&pLVar1[-5].next != id);
  pLVar1[-2].prev = (LLLink *)cb;
  return *(int32 *)&pLVar1[-6].prev;
}

Assistant:

int32
PluginList::setStreamRightsCallback(uint32 id, RightsCallback cb)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id){
			p->rightsCallback = cb;
			return p->offset;
		}
	}
	return -1;
}